

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O0

Value * cmFileAPICMakeFilesDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  undefined1 local_68 [8];
  CMakeFiles cmakeFiles;
  unsigned_long version_local;
  cmFileAPI *fileAPI_local;
  
  cmakeFiles._64_8_ = version;
  anon_unknown.dwarf_984e28::CMakeFiles::CMakeFiles((CMakeFiles *)local_68,fileAPI,version);
  anon_unknown.dwarf_984e28::CMakeFiles::Dump(__return_storage_ptr__,(CMakeFiles *)local_68);
  anon_unknown.dwarf_984e28::CMakeFiles::~CMakeFiles((CMakeFiles *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPICMakeFilesDump(cmFileAPI& fileAPI, unsigned long version)
{
  CMakeFiles cmakeFiles(fileAPI, version);
  return cmakeFiles.Dump();
}